

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O3

int chirc_ctx_add_channel(chirc_ctx_t *ctx,chirc_channel_t *channel)

{
  UT_hash_handle *pUVar1;
  UT_hash_bucket *pUVar2;
  byte bVar3;
  int *piVar4;
  UT_hash_handle *pUVar5;
  UT_hash_handle *pUVar6;
  UT_hash_handle *pUVar7;
  int iVar8;
  UT_hash_table *pUVar9;
  UT_hash_bucket *__ptr;
  UT_hash_bucket *pUVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  int *piVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  
  piVar4 = (int *)channel->name;
  bVar3 = *(byte *)((long)piVar4 + -1);
  uVar11 = 0xfeedbeef;
  uVar12 = 0x9e3779b9;
  piVar15 = piVar4;
  switch(bVar3 & 7) {
  case 0:
    uVar13 = (ulong)(bVar3 >> 3);
    break;
  case 1:
    uVar13 = (ulong)*(byte *)((long)piVar4 + -3);
    break;
  case 2:
    uVar13 = (ulong)*(ushort *)((long)piVar4 + -5);
    break;
  case 3:
    uVar13 = (ulong)*(uint *)((long)piVar4 + -9);
    break;
  case 4:
    uVar13 = *(ulong *)((long)piVar4 + -0x11);
    break;
  default:
    uVar14 = 0;
    goto LAB_00103bd2;
  }
  uVar14 = (uint)uVar13;
  if (uVar14 < 0xc) {
LAB_00103bd2:
    uVar16 = 0x9e3779b9;
  }
  else {
    uVar16 = 0x9e3779b9;
    uVar11 = 0xfeedbeef;
    uVar12 = 0x9e3779b9;
    do {
      uVar11 = uVar11 + piVar15[2];
      uVar16 = uVar11 >> 0xd ^ ((uVar16 + *piVar15) - (uVar12 + piVar15[1])) - uVar11;
      uVar14 = uVar16 << 8 ^ ((uVar12 + piVar15[1]) - uVar11) - uVar16;
      uVar12 = uVar14 >> 0xd ^ (uVar11 - uVar16) - uVar14;
      uVar11 = uVar12 >> 0xc ^ (uVar16 - uVar14) - uVar12;
      uVar14 = uVar11 << 0x10 ^ (uVar14 - uVar12) - uVar11;
      uVar17 = uVar14 >> 5 ^ (uVar12 - uVar11) - uVar14;
      uVar16 = uVar17 >> 3 ^ (uVar11 - uVar14) - uVar17;
      uVar12 = uVar16 << 10 ^ (uVar14 - uVar17) - uVar16;
      uVar11 = uVar12 >> 0xf ^ (uVar17 - uVar16) - uVar12;
      piVar15 = piVar15 + 3;
      uVar14 = (int)uVar13 - 0xc;
      uVar13 = (ulong)uVar14;
    } while (0xb < uVar14);
  }
  switch(bVar3 & 7) {
  case 0:
    uVar17 = (uint)(bVar3 >> 3);
    break;
  case 1:
    uVar17 = (uint)*(byte *)((long)piVar4 + -3);
    break;
  case 2:
    uVar17 = (uint)*(ushort *)((long)piVar4 + -5);
    break;
  case 3:
    uVar17 = *(uint *)((long)piVar4 + -9);
    break;
  case 4:
    uVar17 = (uint)*(undefined8 *)((long)piVar4 + -0x11);
    break;
  default:
    uVar17 = 0;
  }
  uVar11 = uVar11 + uVar17;
  if (uVar14 - 1 < 0xb) {
    iVar8 = (*(code *)(&DAT_0010a0f0 + *(int *)(&DAT_0010a0f0 + (ulong)(uVar14 - 1) * 4)))
                      (uVar16,piVar15);
    return iVar8;
  }
  uVar14 = uVar11 >> 0xd ^ (uVar16 - uVar12) - uVar11;
  uVar16 = uVar14 << 8 ^ (uVar12 - uVar11) - uVar14;
  uVar12 = uVar16 >> 0xd ^ (uVar11 - uVar14) - uVar16;
  uVar11 = uVar12 >> 0xc ^ (uVar14 - uVar16) - uVar12;
  uVar14 = uVar11 << 0x10 ^ (uVar16 - uVar12) - uVar11;
  uVar12 = uVar14 >> 5 ^ (uVar12 - uVar11) - uVar14;
  uVar11 = uVar12 >> 3 ^ (uVar11 - uVar14) - uVar12;
  uVar14 = uVar11 << 10 ^ (uVar14 - uVar12) - uVar11;
  uVar11 = uVar14 >> 0xf ^ uVar12 - (uVar11 + uVar14);
  (channel->hh).hashv = uVar11;
  (channel->hh).key = piVar4;
  switch(*(byte *)((long)piVar4 + -1) & 7) {
  case 0:
    uVar12 = (uint)(*(byte *)((long)piVar4 + -1) >> 3);
    break;
  case 1:
    uVar12 = (uint)*(byte *)((long)piVar4 + -3);
    break;
  case 2:
    uVar12 = (uint)*(ushort *)((long)piVar4 + -5);
    break;
  case 3:
    uVar12 = *(uint *)((long)piVar4 + -9);
    break;
  case 4:
    uVar12 = (uint)*(undefined8 *)((long)piVar4 + -0x11);
    break;
  default:
    uVar12 = 0;
  }
  pUVar1 = &channel->hh;
  (channel->hh).keylen = uVar12;
  if (ctx->channels == (chirc_channel_t *)0x0) {
    pUVar9 = (UT_hash_table *)calloc(1,0x40);
    (channel->hh).prev = (void *)0x0;
    (channel->hh).next = (void *)0x0;
    (channel->hh).tbl = pUVar9;
    if (pUVar9 == (UT_hash_table *)0x0) goto LAB_00103fb7;
    pUVar9->tail = pUVar1;
    pUVar9->num_buckets = 0x20;
    pUVar9->log2_num_buckets = 5;
    pUVar9->hho = 0x28;
    __ptr = (UT_hash_bucket *)calloc(1,0x200);
    pUVar9->buckets = __ptr;
    pUVar9->signature = 0xa0111fe1;
    if (__ptr == (UT_hash_bucket *)0x0) goto LAB_00103fb7;
    ctx->channels = channel;
    uVar12 = 0x20;
  }
  else {
    pUVar9 = (ctx->channels->hh).tbl;
    (channel->hh).tbl = pUVar9;
    (channel->hh).next = (void *)0x0;
    pUVar5 = pUVar9->tail;
    (channel->hh).prev = (void *)((long)pUVar5 - pUVar9->hho);
    pUVar5->next = channel;
    pUVar9->tail = pUVar1;
    uVar12 = pUVar9->num_buckets;
    __ptr = pUVar9->buckets;
  }
  uVar16 = pUVar9->num_items + 1;
  pUVar9->num_items = uVar16;
  uVar11 = uVar12 - 1 & uVar11;
  uVar14 = __ptr[uVar11].count + 1;
  __ptr[uVar11].count = uVar14;
  pUVar5 = __ptr[uVar11].hh_head;
  (channel->hh).hh_next = pUVar5;
  (channel->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar5 != (UT_hash_handle *)0x0) {
    pUVar5->hh_prev = pUVar1;
  }
  __ptr[uVar11].hh_head = pUVar1;
  if ((__ptr[uVar11].expand_mult * 10 + 10 <= uVar14) && (pUVar9->noexpand == 0)) {
    pUVar10 = (UT_hash_bucket *)calloc(1,(ulong)uVar12 << 5);
    if (pUVar10 == (UT_hash_bucket *)0x0) {
LAB_00103fb7:
      exit(-1);
    }
    uVar11 = uVar12 * 2 - 1;
    uVar14 = ((uVar16 >> ((char)pUVar9->log2_num_buckets + 1U & 0x1f)) + 1) -
             (uint)((uVar11 & uVar16) == 0);
    pUVar9->ideal_chain_maxlen = uVar14;
    pUVar9->nonideal_items = 0;
    if (uVar12 != 0) {
      uVar16 = 0;
      uVar13 = 0;
      do {
        pUVar5 = __ptr[uVar13].hh_head;
        while (pUVar5 != (UT_hash_handle *)0x0) {
          pUVar6 = pUVar5->hh_next;
          uVar18 = pUVar5->hashv & uVar11;
          pUVar2 = pUVar10 + uVar18;
          uVar17 = pUVar10[uVar18].count + 1;
          pUVar10[uVar18].count = uVar17;
          if (uVar14 < uVar17) {
            uVar16 = uVar16 + 1;
            pUVar9->nonideal_items = uVar16;
            if (pUVar2->expand_mult * uVar14 < uVar17) {
              pUVar2->expand_mult = pUVar2->expand_mult + 1;
            }
          }
          pUVar5->hh_prev = (UT_hash_handle *)0x0;
          pUVar7 = pUVar2->hh_head;
          pUVar5->hh_next = pUVar7;
          if (pUVar7 != (UT_hash_handle *)0x0) {
            pUVar7->hh_prev = pUVar5;
          }
          pUVar2->hh_head = pUVar5;
          pUVar5 = pUVar6;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar12);
    }
    free(__ptr);
    pUVar9 = pUVar1->tbl;
    pUVar9->num_buckets = pUVar9->num_buckets << 1;
    pUVar9->log2_num_buckets = pUVar9->log2_num_buckets + 1;
    pUVar9->buckets = pUVar10;
    if (pUVar9->num_items >> 1 < pUVar9->nonideal_items) {
      uVar11 = pUVar9->ineff_expands + 1;
      pUVar9->ineff_expands = uVar11;
      if (1 < uVar11) {
        pUVar9->noexpand = 1;
      }
    }
    else {
      pUVar9->ineff_expands = 0;
    }
  }
  return 0;
}

Assistant:

int chirc_ctx_add_channel(chirc_ctx_t *ctx, chirc_channel_t *channel)
{
    HASH_ADD_KEYPTR(hh, ctx->channels, channel->name, sdslen(channel->name), channel);

    return CHIRC_OK;
}